

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableSettings * ImGui::TableSettingsCreate(ImGuiID id,int columns_count)

{
  ImGuiTableSettings *pIVar1;
  ImGuiTableSettings *pIVar2;
  int iVar3;
  
  pIVar1 = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                     (&GImGui->SettingsTables,(long)columns_count * 0x10 + 0x14);
  pIVar1->ID = 0;
  pIVar1->SaveFlags = 0;
  pIVar1->RefScale = 0.0;
  pIVar1->ColumnsCount = 0;
  pIVar1->ColumnsCountMax = 0;
  *(undefined4 *)&pIVar1->WantApply = 0;
  if (0 < columns_count) {
    pIVar2 = pIVar1 + 1;
    iVar3 = columns_count;
    do {
      pIVar2->ID = 0;
      pIVar2->SaveFlags = 0;
      pIVar2->RefScale = -NAN;
      pIVar2->ColumnsCount = -1;
      *(byte *)&pIVar2->ColumnsCountMax = (byte)pIVar2->ColumnsCountMax & 0xf0 | 4;
      pIVar2 = (ImGuiTableSettings *)&pIVar2->WantApply;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  pIVar1->ID = id;
  pIVar1->ColumnsCount = (ImGuiTableColumnIdx)columns_count;
  pIVar1->ColumnsCountMax = (ImGuiTableColumnIdx)columns_count;
  pIVar1->WantApply = true;
  return pIVar1;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsCreate(ImGuiID id, int columns_count)
{
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = g.SettingsTables.alloc_chunk(TableSettingsCalcChunkSize(columns_count));
    TableSettingsInit(settings, id, columns_count, columns_count);
    return settings;
}